

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hh
# Opt level: O2

void __thiscall
tchecker::pool_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>::
allocate_raw_block(pool_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_> *this
                  )

{
  ulong uVar1;
  char *pcVar2;
  
  if (this->_raw_head == this->_raw_end) {
    uVar1 = this->_block_size;
    pcVar2 = (char *)operator_new__(uVar1);
    this->_raw_end = pcVar2 + uVar1;
    *(char **)pcVar2 = this->_block_head;
    this->_block_head = pcVar2;
    this->_raw_head = pcVar2 + 8;
    this->_blocks_count = this->_blocks_count + 1;
    return;
  }
  __assert_fail("_raw_head == _raw_end",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/pool.hh"
                ,0x1a5,
                "void tchecker::pool_t<tchecker::make_shared_t<tchecker::zg::state_t>>::allocate_raw_block() [T = tchecker::make_shared_t<tchecker::zg::state_t>]"
               );
}

Assistant:

inline void allocate_raw_block()
  {
    assert(_raw_head == _raw_end);
    // allocate
    _raw_head = new char[_block_size];
    _raw_end = _raw_head + _block_size;
    // link to allocated blocks
    nextblock(_raw_head) = _block_head;
    _block_head = _raw_head;
    // jump over 1st word used for linking chunks
    _raw_head = first_chunk_ptr(_raw_head);
    // count one more block
    ++_blocks_count;
  }